

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int mem_live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  uint uVar2;
  uint uVar3;
  DLIST_out_edge_t *pDVar4;
  
  uVar3 = 0;
  pDVar4 = &bb->out_edges;
  while (peVar1 = pDVar4->head, peVar1 != (out_edge_t)0x0) {
    uVar2 = bitmap_ior(bb->out,bb->out,peVar1->dst->in);
    uVar3 = uVar3 | uVar2;
    pDVar4 = (DLIST_out_edge_t *)&(peVar1->out_link).next;
  }
  return uVar3;
}

Assistant:

static int mem_live_con_func_n (gen_ctx_t gen_ctx MIR_UNUSED, bb_t bb) {
  edge_t e;
  int change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
    change_p |= bitmap_ior (bb->mem_live_out, bb->mem_live_out, e->dst->mem_live_in);
  return change_p;
}